

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::anon_unknown_5::TileBufferTask::execute(TileBufferTask *this)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  reference pvVar4;
  char *endPtr_00;
  char **in_RDI;
  exception *e;
  int compSize;
  char *compPtr;
  char *endPtr;
  char *readPtr;
  intptr_t base;
  int yOffset;
  int xOffset;
  TOutSliceInfo *slice;
  uint i;
  int y;
  int numPixelsPerScanLine;
  int numScanLines;
  Box2i tileRange;
  char *writePtr;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffef4;
  long *plVar7;
  Array<char> *tileBuffer;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar8;
  undefined8 in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  char **writePtr_00;
  TileDescription *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  PixelType in_stack_ffffffffffffff78;
  Format in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  undefined4 uStack_74;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  uint local_44;
  int local_40;
  int local_30;
  int local_28;
  
  ppcVar2 = (char **)Array::operator_cast_to_char_((Array *)in_RDI[3]);
  uVar5 = *(undefined4 *)(in_RDI[3] + 0x28);
  uVar6 = *(undefined4 *)(in_RDI[3] + 0x2c);
  writePtr_00 = ppcVar2;
  Imf_3_2::dataWindowForTile
            (in_stack_ffffffffffffff68,(int)((ulong)ppcVar2 >> 0x20),(int)ppcVar2,
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  for (local_40 = local_30; local_40 <= local_28; local_40 = local_40 + 1) {
    local_44 = 0;
    while( true ) {
      endPtr_00 = (char *)(ulong)local_44;
      pcVar3 = (char *)std::
                       vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                       ::size((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                               *)(in_RDI[2] + 0xe8));
      if (pcVar3 <= endPtr_00) break;
      pvVar4 = std::
               vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ::operator[]((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                             *)(in_RDI[2] + 0xe8),(ulong)local_44);
      if ((pvVar4->zero & 1U) == 0) {
        copyFromFrameBuffer(writePtr_00,in_RDI,endPtr_00,in_stack_ffffffffffffff48,
                            (Format)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                            (PixelType)in_stack_ffffffffffffff40);
      }
      else {
        fillChannelWithZeroes
                  ((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      local_44 = local_44 + 1;
    }
  }
  pcVar3 = Array::operator_cast_to_char_((Array *)in_RDI[3]);
  *(int *)(in_RDI[3] + 0x18) = (int)ppcVar2 - (int)pcVar3;
  pcVar3 = Array::operator_cast_to_char_((Array *)in_RDI[3]);
  *(char **)(in_RDI[3] + 0x10) = pcVar3;
  if (*(long *)(in_RDI[3] + 0x20) != 0) {
    pcVar3 = in_RDI[3];
    plVar7 = *(long **)(pcVar3 + 0x20);
    tileBuffer = *(Array<char> **)(pcVar3 + 0x10);
    uVar8 = *(undefined4 *)(pcVar3 + 0x18);
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              ((Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffef4,uVar6),
               (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffeec,uVar5));
    iVar1 = (**(code **)(*plVar7 + 0x28))
                      (plVar7,tileBuffer,uVar8,&stack0xffffffffffffff74,&stack0xffffffffffffff88);
    if (iVar1 < *(int *)(in_RDI[3] + 0x18)) {
      *(int *)(in_RDI[3] + 0x18) = iVar1;
      *(ulong *)(in_RDI[3] + 0x10) = CONCAT44(uStack_74,in_stack_ffffffffffffff88);
    }
    else if (*(int *)(in_RDI[2] + 0xe0) == 0) {
      convertToXdr((Data *)CONCAT44(uVar8,in_stack_ffffffffffffff20),tileBuffer,
                   (int)((ulong)plVar7 >> 0x20),(int)plVar7);
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the frame buffer
        // into the tile buffer
        //
        // Convert one tile's worth of pixel data to
        // a machine-independent representation, and store
        // the result in _tileBuffer->buffer.
        //

        char* writePtr = _tileBuffer->buffer;

        Box2i tileRange = dataWindowForTile (
            _ofd->tileDesc,
            _ofd->minX,
            _ofd->maxX,
            _ofd->minY,
            _ofd->maxY,
            _tileBuffer->tileCoord.dx,
            _tileBuffer->tileCoord.dy,
            _tileBuffer->tileCoord.lx,
            _tileBuffer->tileCoord.ly);

        int numScanLines         = tileRange.max.y - tileRange.min.y + 1;
        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                const TOutSliceInfo& slice = _ofd->slices[i];

                //
                // These offsets are used to facilitate both absolute
                // and tile-relative pixel coordinates.
                //

                int xOffset = slice.xTileCoords * tileRange.min.x;
                int yOffset = slice.yTileCoords * tileRange.min.y;

                //
                // Fill the tile buffer with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _data->tileBuffer.
                    //

                    fillChannelWithZeroes (
                        writePtr,
                        _ofd->format,
                        slice.type,
                        numPixelsPerScanLine);
                }
                else
                {
                    //
                    // The frame buffer contains data for this channel.
                    //

                    intptr_t    base = reinterpret_cast<intptr_t> (slice.base);
                    const char* readPtr = reinterpret_cast<const char*> (
                        base + (y - yOffset) * slice.yStride +
                        (tileRange.min.x - xOffset) * slice.xStride);

                    const char* endPtr =
                        readPtr + (numPixelsPerScanLine - 1) * slice.xStride;

                    copyFromFrameBuffer (
                        writePtr,
                        readPtr,
                        endPtr,
                        slice.xStride,
                        _ofd->format,
                        slice.type);
                }
            }
        }

        //
        // Compress the contents of the tileBuffer,
        // and store the compressed data in the output file.
        //

        _tileBuffer->dataSize = writePtr - _tileBuffer->buffer;
        _tileBuffer->dataPtr  = _tileBuffer->buffer;

        if (_tileBuffer->compressor)
        {
            const char* compPtr;

            int compSize = _tileBuffer->compressor->compressTile (
                _tileBuffer->dataPtr,
                _tileBuffer->dataSize,
                tileRange,
                compPtr);

            if (compSize < _tileBuffer->dataSize)
            {
                _tileBuffer->dataSize = compSize;
                _tileBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using native format,
                // so we need to convert the lineBuffer to Xdr.
                //

                convertToXdr (
                    _ofd,
                    _tileBuffer->buffer,
                    numScanLines,
                    numPixelsPerScanLine);
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}